

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  LogMessage *pLVar1;
  int local_48;
  int count;
  LogMessage local_30;
  Voidify local_19;
  char *local_18;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_18 = ptr;
  ptr_local = (char *)this;
  if (ptr <= this->buffer_end_ + 0x10) {
    if (this->next_chunk_ == this->patch_buffer_) {
      local_48 = BytesAvailable(this,ptr);
    }
    else {
      local_48 = this->size_ + ((int)this->buffer_end_ - (int)ptr);
    }
    if (0 < local_48) {
      StreamBackUp(this,local_48);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
             ,0x6e,"ptr <= buffer_end_ + kSlopBytes");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void BackUp(const char* ptr) {
    ABSL_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == patch_buffer_) {
      count = BytesAvailable(ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }